

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O3

void __thiscall APowerFlight::EndEffect(APowerFlight *this)

{
  double dVar1;
  ulong uVar2;
  AActor *pAVar3;
  
  APowerup::EndEffect(&this->super_APowerup);
  pAVar3 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  if (pAVar3 != (AActor *)0x0) {
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if ((pAVar3->player != (player_t *)0x0) && (((pAVar3->flags7).Value & 0x20000) == 0)) {
        dVar1 = (pAVar3->__Pos).Z;
        if ((dVar1 != pAVar3->floorz) || (NAN(dVar1) || NAN(pAVar3->floorz))) {
          pAVar3->player->centering = true;
        }
        uVar2._0_4_ = pAVar3->flags;
        uVar2._4_4_ = pAVar3->flags2;
        pAVar3->flags = (ActorFlags)(int)(uVar2 & 0xffffffeffffffdff);
        pAVar3->flags2 = (ActorFlags2)(int)((uVar2 & 0xffffffeffffffdff) >> 0x20);
      }
    }
    else {
      (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
    }
  }
  return;
}

Assistant:

void APowerFlight::EndEffect ()
{
	Super::EndEffect();
	if (Owner == NULL || Owner->player == NULL)
	{
		return;
	}

	if (!(Owner->flags7 & MF7_FLYCHEAT))
	{
		if (Owner->Z() != Owner->floorz)
		{
			Owner->player->centering = true;
		}
		Owner->flags2 &= ~MF2_FLY;
		Owner->flags &= ~MF_NOGRAVITY;
	}
//	BorderTopRefresh = screen->GetPageCount (); //make sure the sprite's cleared out
}